

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es32cRobustBufferAccessBehaviorTests.cpp
# Opt level: O2

void __thiscall
es32cts::RobustBufferAccessBehavior::ImageLoadStoreTest::setTextures
          (ImageLoadStoreTest *this,GLuint id_destination,GLuint id_source)

{
  TEST_CASES TVar1;
  int iVar2;
  deUint32 dVar3;
  undefined8 in_RAX;
  undefined4 uVar5;
  undefined4 extraout_var;
  TestError *this_00;
  undefined8 uVar6;
  undefined4 uVar7;
  long lVar4;
  
  uVar5 = (undefined4)((ulong)in_RAX >> 0x20);
  iVar2 = (*((this->super_TexelFetchTest).super_TexelFetchTest.super_TestCase.m_context)->
            m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  TVar1 = (this->super_TexelFetchTest).super_TexelFetchTest.m_test_case;
  if (TVar1 == RGBA32F) {
    uVar7 = 0x8814;
    uVar6 = 0;
  }
  else {
    if (TVar1 != R32UI_MIPMAP) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles32/es32cRobustBufferAccessBehaviorTests.cpp"
                 ,0x3ef);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    uVar7 = 0x8236;
    uVar6 = 1;
  }
  (**(code **)(lVar4 + 0x80))(0,id_source,uVar6,0,0,35000,CONCAT44(uVar5,uVar7));
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"BindImageTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles32/es32cRobustBufferAccessBehaviorTests.cpp"
                  ,0x3f3);
  (**(code **)(lVar4 + 0x80))(1,id_destination,uVar6,0,0,0x88b9,uVar7);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"BindImageTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles32/es32cRobustBufferAccessBehaviorTests.cpp"
                  ,0x3f7);
  return;
}

Assistant:

void ImageLoadStoreTest::setTextures(glw::GLuint id_destination, glw::GLuint id_source)
{
	const Functions& gl = m_context.getRenderContext().getFunctions();

	GLenum format = 0;
	GLint  level  = 0;

	switch (m_test_case)
	{
	case RGBA32F:
		format = GL_RGBA32F;
		break;
	case R32UI_MIPMAP:
		format = GL_R32UI;
		level  = 1;
		break;
	default:
		TCU_FAIL("Invalid enum");
	}

	gl.bindImageTexture(0 /* unit */, id_source, level, GL_FALSE /* layered */, 0 /* layer */, GL_READ_ONLY, format);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindImageTexture");

	gl.bindImageTexture(1 /* unit */, id_destination, level, GL_FALSE /* layered */, 0 /* layer */, GL_WRITE_ONLY,
						format);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindImageTexture");
}